

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book.cc
# Opt level: O2

execution * __thiscall
helix::order_book::execute
          (execution *__return_storage_ptr__,order_book *this,uint64_t order_id,uint64_t quantity)

{
  type *this_00;
  long *plVar1;
  size_type *psVar2;
  side_type sVar3;
  uint64_t uVar4;
  bool bVar5;
  iterator x;
  invalid_argument *this_01;
  allocator local_a1;
  iterator it;
  uint64_t order_id_local;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &(this->_orders).super_type;
  order_id_local = order_id;
  x = boost::multi_index::detail::
      hashed_index<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::multi_index::detail::nth_layer<1,_helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
      ::find<unsigned_long>(this_00,&order_id_local);
  it = x;
  if (x.node != (this->_orders).
                super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<helix::order,_std::allocator<helix::order>_>_>_*,_boost::multi_index::multi_index_container<helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>_>
                .member) {
    plVar1 = (long *)((long)&((x.node)->
                             super_index_node_base<helix::order,_std::allocator<helix::order>_>).
                             super_pod_value_holder<helix::order>.space.data_ + 0x18);
    *plVar1 = *plVar1 - quantity;
    plVar1 = (long *)((long)((x.node)->
                            super_index_node_base<helix::order,_std::allocator<helix::order>_>).
                            super_pod_value_holder<helix::order>.space.data_.align_ + 8);
    *plVar1 = *plVar1 - quantity;
    bVar5 = boost::multi_index::detail::
            hashed_index<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::multi_index::detail::nth_layer<1,_helix::order,_boost::multi_index::indexed_by<boost::multi_index::hashed_unique<boost::multi_index::member<helix::order,_unsigned_long,_&helix::order::id>,_mpl_::na,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<helix::order>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
            ::modify_(this_00,x.node);
    if (!bVar5) {
      operator_delete(x.node,0x40);
      psVar2 = &(this->_orders).node_count;
      *psVar2 = *psVar2 - 1;
    }
    sVar3 = ((x.node)->super_index_node_base<helix::order,_std::allocator<helix::order>_>).
            super_pod_value_holder<helix::order>.space.data_.buf[0x20];
    uVar4 = *(uint64_t *)
             ((long)((x.node)->super_index_node_base<helix::order,_std::allocator<helix::order>_>).
                    super_pod_value_holder<helix::order>.space.data_.align_ + 8);
    __return_storage_ptr__->price =
         *(uint64_t *)
          ((long)&((x.node)->super_index_node_base<helix::order,_std::allocator<helix::order>_>).
                  super_pod_value_holder<helix::order>.space.data_ + 0x10);
    __return_storage_ptr__->side = sVar3;
    __return_storage_ptr__->remaining = uVar4;
    if (*(long *)((long)&((x.node)->
                         super_index_node_base<helix::order,_std::allocator<helix::order>_>).
                         super_pod_value_holder<helix::order>.space.data_ + 0x18) == 0) {
      remove(this,(char *)&it);
    }
    return __return_storage_ptr__;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_70,"invalid order id: ",&local_a1);
  std::__cxx11::to_string(&local_90,order_id_local);
  std::operator+(&local_50,&local_70,&local_90);
  std::invalid_argument::invalid_argument(this_01,(string *)&local_50);
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

execution order_book::execute(uint64_t order_id, uint64_t quantity)
{
    auto it = _orders.find(order_id);
    if (it == _orders.end()) {
        throw std::invalid_argument(std::string("invalid order id: ") + std::to_string(order_id));
    }
    _orders.modify(it, [quantity](order& order) {
        order.quantity -= quantity;
        order.level->size -= quantity;
    });
    auto result = execution(it->price, it->side, it->level->size);
    if (!it->quantity) {
        remove(it);
    }
    return result;
}